

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaInitTypes(void)

{
  xmlSchemaTypePtr pxVar1;
  xmlChar *__s;
  xmlSchemaParticlePtr pxVar2;
  xmlSchemaTreeItemPtr_conflict __s_00;
  xmlSchemaWildcardPtr __s_01;
  xmlSchemaWildcardPtr wild;
  xmlSchemaModelGroupPtr sequence;
  xmlSchemaParticlePtr particle;
  
  if (xmlSchemaTypesInitialized == 0) {
    xmlSchemaNAN = NAN;
    xmlSchemaPINF = INFINITY;
    xmlSchemaNINF = -INFINITY;
    xmlSchemaTypesBank = xmlHashCreate(0x28);
    if (xmlSchemaTypesBank == (xmlHashTablePtr)0x0) {
      xmlSchemaTypeErrMemory();
    }
    else {
      xmlSchemaTypeAnyTypeDef =
           xmlSchemaInitBasicType("anyType",XML_SCHEMAS_ANYTYPE,(xmlSchemaTypePtr)0x0);
      if (xmlSchemaTypeAnyTypeDef != (xmlSchemaTypePtr)0x0) {
        xmlSchemaTypeAnyTypeDef->baseType = xmlSchemaTypeAnyTypeDef;
        xmlSchemaTypeAnyTypeDef->contentType = XML_SCHEMA_CONTENT_MIXED;
        xmlSchemaTypeAnyTypeDef->contentType = XML_SCHEMA_CONTENT_MIXED;
        pxVar1 = (xmlSchemaTypePtr)xmlSchemaAddParticle();
        if (pxVar1 != (xmlSchemaTypePtr)0x0) {
          xmlSchemaTypeAnyTypeDef->subtypes = pxVar1;
          __s = (xmlChar *)(*xmlMalloc)(0x28);
          if (__s == (xmlChar *)0x0) {
            xmlSchemaTypeErrMemory();
          }
          else {
            memset(__s,0,0x28);
            __s[0] = '\x06';
            __s[1] = '\0';
            __s[2] = '\0';
            __s[3] = '\0';
            pxVar1->id = __s;
            pxVar2 = xmlSchemaAddParticle();
            if (pxVar2 != (xmlSchemaParticlePtr)0x0) {
              pxVar2->minOccurs = 0;
              pxVar2->maxOccurs = 0x40000000;
              *(xmlSchemaParticlePtr *)(__s + 0x18) = pxVar2;
              __s_00 = (xmlSchemaTreeItemPtr_conflict)(*xmlMalloc)(0x48);
              if (__s_00 == (xmlSchemaTreeItemPtr_conflict)0x0) {
                xmlSchemaTypeErrMemory();
              }
              else {
                memset(__s_00,0,0x48);
                __s_00->type = XML_SCHEMA_TYPE_ANY;
                *(undefined4 *)((long)&__s_00[1].annot + 4) = 1;
                *(undefined4 *)&__s_00[1].annot = 2;
                pxVar2->children = __s_00;
                __s_01 = (xmlSchemaWildcardPtr)(*xmlMalloc)(0x48);
                if (__s_01 == (xmlSchemaWildcardPtr)0x0) {
                  xmlSchemaTypeErrMemory();
                }
                else {
                  memset(__s_01,0,0x48);
                  __s_01->any = 1;
                  __s_01->processContents = 2;
                  xmlSchemaTypeAnyTypeDef->attributeWildcard = __s_01;
                  xmlSchemaTypeAnySimpleTypeDef =
                       xmlSchemaInitBasicType
                                 ("anySimpleType",XML_SCHEMAS_ANYSIMPLETYPE,xmlSchemaTypeAnyTypeDef)
                  ;
                  if (((((xmlSchemaTypeAnySimpleTypeDef != (xmlSchemaTypePtr)0x0) &&
                        (xmlSchemaTypeStringDef =
                              xmlSchemaInitBasicType
                                        ("string",XML_SCHEMAS_STRING,xmlSchemaTypeAnySimpleTypeDef),
                        xmlSchemaTypeStringDef != (xmlSchemaTypePtr)0x0)) &&
                       (xmlSchemaTypeDecimalDef =
                             xmlSchemaInitBasicType
                                       ("decimal",XML_SCHEMAS_DECIMAL,xmlSchemaTypeAnySimpleTypeDef)
                       , xmlSchemaTypeDecimalDef != (xmlSchemaTypePtr)0x0)) &&
                      (((xmlSchemaTypeDateDef =
                              xmlSchemaInitBasicType
                                        ("date",XML_SCHEMAS_DATE,xmlSchemaTypeAnySimpleTypeDef),
                        xmlSchemaTypeDateDef != (xmlSchemaTypePtr)0x0 &&
                        (xmlSchemaTypeDatetimeDef =
                              xmlSchemaInitBasicType
                                        ("dateTime",XML_SCHEMAS_DATETIME,
                                         xmlSchemaTypeAnySimpleTypeDef),
                        xmlSchemaTypeDatetimeDef != (xmlSchemaTypePtr)0x0)) &&
                       ((xmlSchemaTypeTimeDef =
                              xmlSchemaInitBasicType
                                        ("time",XML_SCHEMAS_TIME,xmlSchemaTypeAnySimpleTypeDef),
                        xmlSchemaTypeTimeDef != (xmlSchemaTypePtr)0x0 &&
                        ((xmlSchemaTypeGYearDef =
                               xmlSchemaInitBasicType
                                         ("gYear",XML_SCHEMAS_GYEAR,xmlSchemaTypeAnySimpleTypeDef),
                         xmlSchemaTypeGYearDef != (xmlSchemaTypePtr)0x0 &&
                         (xmlSchemaTypeGYearMonthDef =
                               xmlSchemaInitBasicType
                                         ("gYearMonth",XML_SCHEMAS_GYEARMONTH,
                                          xmlSchemaTypeAnySimpleTypeDef),
                         xmlSchemaTypeGYearMonthDef != (xmlSchemaTypePtr)0x0)))))))) &&
                     (((((xmlSchemaTypeGMonthDef =
                               xmlSchemaInitBasicType
                                         ("gMonth",XML_SCHEMAS_GMONTH,xmlSchemaTypeAnySimpleTypeDef)
                         , xmlSchemaTypeGMonthDef != (xmlSchemaTypePtr)0x0 &&
                         ((((xmlSchemaTypeGMonthDayDef =
                                  xmlSchemaInitBasicType
                                            ("gMonthDay",XML_SCHEMAS_GMONTHDAY,
                                             xmlSchemaTypeAnySimpleTypeDef),
                            xmlSchemaTypeGMonthDayDef != (xmlSchemaTypePtr)0x0 &&
                            (xmlSchemaTypeGDayDef =
                                  xmlSchemaInitBasicType
                                            ("gDay",XML_SCHEMAS_GDAY,xmlSchemaTypeAnySimpleTypeDef),
                            xmlSchemaTypeGDayDef != (xmlSchemaTypePtr)0x0)) &&
                           (xmlSchemaTypeDurationDef =
                                 xmlSchemaInitBasicType
                                           ("duration",XML_SCHEMAS_DURATION,
                                            xmlSchemaTypeAnySimpleTypeDef),
                           xmlSchemaTypeDurationDef != (xmlSchemaTypePtr)0x0)) &&
                          ((xmlSchemaTypeFloatDef =
                                 xmlSchemaInitBasicType
                                           ("float",XML_SCHEMAS_FLOAT,xmlSchemaTypeAnySimpleTypeDef)
                           , xmlSchemaTypeFloatDef != (xmlSchemaTypePtr)0x0 &&
                           (xmlSchemaTypeDoubleDef =
                                 xmlSchemaInitBasicType
                                           ("double",XML_SCHEMAS_DOUBLE,
                                            xmlSchemaTypeAnySimpleTypeDef),
                           xmlSchemaTypeDoubleDef != (xmlSchemaTypePtr)0x0)))))) &&
                        ((xmlSchemaTypeBooleanDef =
                               xmlSchemaInitBasicType
                                         ("boolean",XML_SCHEMAS_BOOLEAN,
                                          xmlSchemaTypeAnySimpleTypeDef),
                         xmlSchemaTypeBooleanDef != (xmlSchemaTypePtr)0x0 &&
                         ((xmlSchemaTypeAnyURIDef =
                                xmlSchemaInitBasicType
                                          ("anyURI",XML_SCHEMAS_ANYURI,xmlSchemaTypeAnySimpleTypeDef
                                          ), xmlSchemaTypeAnyURIDef != (xmlSchemaTypePtr)0x0 &&
                          (xmlSchemaTypeHexBinaryDef =
                                xmlSchemaInitBasicType
                                          ("hexBinary",XML_SCHEMAS_HEXBINARY,
                                           xmlSchemaTypeAnySimpleTypeDef),
                          xmlSchemaTypeHexBinaryDef != (xmlSchemaTypePtr)0x0)))))) &&
                       (xmlSchemaTypeBase64BinaryDef =
                             xmlSchemaInitBasicType
                                       ("base64Binary",XML_SCHEMAS_BASE64BINARY,
                                        xmlSchemaTypeAnySimpleTypeDef),
                       xmlSchemaTypeBase64BinaryDef != (xmlSchemaTypePtr)0x0)) &&
                      (((((((xmlSchemaTypeNotationDef =
                                  xmlSchemaInitBasicType
                                            ("NOTATION",XML_SCHEMAS_NOTATION,
                                             xmlSchemaTypeAnySimpleTypeDef),
                            xmlSchemaTypeNotationDef != (xmlSchemaTypePtr)0x0 &&
                            (xmlSchemaTypeQNameDef =
                                  xmlSchemaInitBasicType
                                            ("QName",XML_SCHEMAS_QNAME,xmlSchemaTypeAnySimpleTypeDef
                                            ), xmlSchemaTypeQNameDef != (xmlSchemaTypePtr)0x0)) &&
                           (xmlSchemaTypeIntegerDef =
                                 xmlSchemaInitBasicType
                                           ("integer",XML_SCHEMAS_INTEGER,xmlSchemaTypeDecimalDef),
                           xmlSchemaTypeIntegerDef != (xmlSchemaTypePtr)0x0)) &&
                          ((xmlSchemaTypeNonPositiveIntegerDef =
                                 xmlSchemaInitBasicType
                                           ("nonPositiveInteger",XML_SCHEMAS_NPINTEGER,
                                            xmlSchemaTypeIntegerDef),
                           xmlSchemaTypeNonPositiveIntegerDef != (xmlSchemaTypePtr)0x0 &&
                           (xmlSchemaTypeNegativeIntegerDef =
                                 xmlSchemaInitBasicType
                                           ("negativeInteger",XML_SCHEMAS_NINTEGER,
                                            xmlSchemaTypeNonPositiveIntegerDef),
                           xmlSchemaTypeNegativeIntegerDef != (xmlSchemaTypePtr)0x0)))) &&
                         (((xmlSchemaTypeLongDef =
                                 xmlSchemaInitBasicType
                                           ("long",XML_SCHEMAS_LONG,xmlSchemaTypeIntegerDef),
                           xmlSchemaTypeLongDef != (xmlSchemaTypePtr)0x0 &&
                           ((xmlSchemaTypeIntDef =
                                  xmlSchemaInitBasicType("int",XML_SCHEMAS_INT,xmlSchemaTypeLongDef)
                            , xmlSchemaTypeIntDef != (xmlSchemaTypePtr)0x0 &&
                            (xmlSchemaTypeShortDef =
                                  xmlSchemaInitBasicType
                                            ("short",XML_SCHEMAS_SHORT,xmlSchemaTypeIntDef),
                            xmlSchemaTypeShortDef != (xmlSchemaTypePtr)0x0)))) &&
                          (xmlSchemaTypeByteDef =
                                xmlSchemaInitBasicType
                                          ("byte",XML_SCHEMAS_BYTE,xmlSchemaTypeShortDef),
                          xmlSchemaTypeByteDef != (xmlSchemaTypePtr)0x0)))) &&
                        (((xmlSchemaTypeNonNegativeIntegerDef =
                                xmlSchemaInitBasicType
                                          ("nonNegativeInteger",XML_SCHEMAS_NNINTEGER,
                                           xmlSchemaTypeIntegerDef),
                          xmlSchemaTypeNonNegativeIntegerDef != (xmlSchemaTypePtr)0x0 &&
                          (xmlSchemaTypeUnsignedLongDef =
                                xmlSchemaInitBasicType
                                          ("unsignedLong",XML_SCHEMAS_ULONG,
                                           xmlSchemaTypeNonNegativeIntegerDef),
                          xmlSchemaTypeUnsignedLongDef != (xmlSchemaTypePtr)0x0)) &&
                         (xmlSchemaTypeUnsignedIntDef =
                               xmlSchemaInitBasicType
                                         ("unsignedInt",XML_SCHEMAS_UINT,
                                          xmlSchemaTypeUnsignedLongDef),
                         xmlSchemaTypeUnsignedIntDef != (xmlSchemaTypePtr)0x0)))) &&
                       ((((xmlSchemaTypeUnsignedShortDef =
                                xmlSchemaInitBasicType
                                          ("unsignedShort",XML_SCHEMAS_USHORT,
                                           xmlSchemaTypeUnsignedIntDef),
                          xmlSchemaTypeUnsignedShortDef != (xmlSchemaTypePtr)0x0 &&
                          (xmlSchemaTypeUnsignedByteDef =
                                xmlSchemaInitBasicType
                                          ("unsignedByte",XML_SCHEMAS_UBYTE,
                                           xmlSchemaTypeUnsignedShortDef),
                          xmlSchemaTypeUnsignedByteDef != (xmlSchemaTypePtr)0x0)) &&
                         ((xmlSchemaTypePositiveIntegerDef =
                                xmlSchemaInitBasicType
                                          ("positiveInteger",XML_SCHEMAS_PINTEGER,
                                           xmlSchemaTypeNonNegativeIntegerDef),
                          xmlSchemaTypePositiveIntegerDef != (xmlSchemaTypePtr)0x0 &&
                          ((xmlSchemaTypeNormStringDef =
                                 xmlSchemaInitBasicType
                                           ("normalizedString",XML_SCHEMAS_NORMSTRING,
                                            xmlSchemaTypeStringDef),
                           xmlSchemaTypeNormStringDef != (xmlSchemaTypePtr)0x0 &&
                           (xmlSchemaTypeTokenDef =
                                 xmlSchemaInitBasicType
                                           ("token",XML_SCHEMAS_TOKEN,xmlSchemaTypeNormStringDef),
                           xmlSchemaTypeTokenDef != (xmlSchemaTypePtr)0x0)))))) &&
                        ((xmlSchemaTypeLanguageDef =
                               xmlSchemaInitBasicType
                                         ("language",XML_SCHEMAS_LANGUAGE,xmlSchemaTypeTokenDef),
                         xmlSchemaTypeLanguageDef != (xmlSchemaTypePtr)0x0 &&
                         (((((xmlSchemaTypeNameDef =
                                   xmlSchemaInitBasicType
                                             ("Name",XML_SCHEMAS_NAME,xmlSchemaTypeTokenDef),
                             xmlSchemaTypeNameDef != (xmlSchemaTypePtr)0x0 &&
                             (xmlSchemaTypeNmtokenDef =
                                   xmlSchemaInitBasicType
                                             ("NMTOKEN",XML_SCHEMAS_NMTOKEN,xmlSchemaTypeTokenDef),
                             xmlSchemaTypeNmtokenDef != (xmlSchemaTypePtr)0x0)) &&
                            (xmlSchemaTypeNCNameDef =
                                  xmlSchemaInitBasicType
                                            ("NCName",XML_SCHEMAS_NCNAME,xmlSchemaTypeNameDef),
                            xmlSchemaTypeNCNameDef != (xmlSchemaTypePtr)0x0)) &&
                           ((xmlSchemaTypeIdDef =
                                  xmlSchemaInitBasicType("ID",XML_SCHEMAS_ID,xmlSchemaTypeNCNameDef)
                            , xmlSchemaTypeIdDef != (xmlSchemaTypePtr)0x0 &&
                            (xmlSchemaTypeIdrefDef =
                                  xmlSchemaInitBasicType
                                            ("IDREF",XML_SCHEMAS_IDREF,xmlSchemaTypeNCNameDef),
                            xmlSchemaTypeIdrefDef != (xmlSchemaTypePtr)0x0)))) &&
                          ((xmlSchemaTypeEntityDef =
                                 xmlSchemaInitBasicType
                                           ("ENTITY",XML_SCHEMAS_ENTITY,xmlSchemaTypeNCNameDef),
                           xmlSchemaTypeEntityDef != (xmlSchemaTypePtr)0x0 &&
                           (xmlSchemaTypeEntitiesDef =
                                 xmlSchemaInitBasicType
                                           ("ENTITIES",XML_SCHEMAS_ENTITIES,
                                            xmlSchemaTypeAnySimpleTypeDef),
                           xmlSchemaTypeEntitiesDef != (xmlSchemaTypePtr)0x0)))))))))))))) {
                    xmlSchemaTypeEntitiesDef->subtypes = xmlSchemaTypeEntityDef;
                    xmlSchemaTypeIdrefsDef =
                         xmlSchemaInitBasicType
                                   ("IDREFS",XML_SCHEMAS_IDREFS,xmlSchemaTypeAnySimpleTypeDef);
                    if (xmlSchemaTypeIdrefsDef != (xmlSchemaTypePtr)0x0) {
                      xmlSchemaTypeIdrefsDef->subtypes = xmlSchemaTypeIdrefDef;
                      xmlSchemaTypeNmtokensDef =
                           xmlSchemaInitBasicType
                                     ("NMTOKENS",XML_SCHEMAS_NMTOKENS,xmlSchemaTypeAnySimpleTypeDef)
                      ;
                      if (xmlSchemaTypeNmtokensDef != (xmlSchemaTypePtr)0x0) {
                        xmlSchemaTypeNmtokensDef->subtypes = xmlSchemaTypeNmtokenDef;
                        xmlSchemaTypesInitialized = 1;
                        return 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    xmlSchemaCleanupTypesInternal();
    particle._4_4_ = -1;
  }
  else {
    particle._4_4_ = 0;
  }
  return particle._4_4_;
}

Assistant:

int
xmlSchemaInitTypes(void)
{
    if (xmlSchemaTypesInitialized != 0)
        return (0);

#if defined(NAN) && defined(INFINITY)
    xmlSchemaNAN = NAN;
    xmlSchemaPINF = INFINITY;
    xmlSchemaNINF = -INFINITY;
#else
    /* MSVC doesn't allow division by zero in constant expressions. */
    double zero = 0.0;
    xmlSchemaNAN = 0.0 / zero;
    xmlSchemaPINF = 1.0 / zero;
    xmlSchemaNINF = -xmlSchemaPINF;
#endif

    xmlSchemaTypesBank = xmlHashCreate(40);
    if (xmlSchemaTypesBank == NULL) {
	xmlSchemaTypeErrMemory();
        goto error;
    }

    /*
    * 3.4.7 Built-in Complex Type Definition
    */
    xmlSchemaTypeAnyTypeDef = xmlSchemaInitBasicType("anyType",
                                                     XML_SCHEMAS_ANYTYPE,
						     NULL);
    if (xmlSchemaTypeAnyTypeDef == NULL)
        goto error;
    xmlSchemaTypeAnyTypeDef->baseType = xmlSchemaTypeAnyTypeDef;
    xmlSchemaTypeAnyTypeDef->contentType = XML_SCHEMA_CONTENT_MIXED;
    /*
    * Init the content type.
    */
    xmlSchemaTypeAnyTypeDef->contentType = XML_SCHEMA_CONTENT_MIXED;
    {
	xmlSchemaParticlePtr particle;
	xmlSchemaModelGroupPtr sequence;
	xmlSchemaWildcardPtr wild;
	/* First particle. */
	particle = xmlSchemaAddParticle();
	if (particle == NULL)
	    goto error;
	xmlSchemaTypeAnyTypeDef->subtypes = (xmlSchemaTypePtr) particle;
	/* Sequence model group. */
	sequence = (xmlSchemaModelGroupPtr)
	    xmlMalloc(sizeof(xmlSchemaModelGroup));
	if (sequence == NULL) {
	    xmlSchemaTypeErrMemory();
	    goto error;
	}
	memset(sequence, 0, sizeof(xmlSchemaModelGroup));
	sequence->type = XML_SCHEMA_TYPE_SEQUENCE;
	particle->children = (xmlSchemaTreeItemPtr) sequence;
	/* Second particle. */
	particle = xmlSchemaAddParticle();
	if (particle == NULL)
	    goto error;
	particle->minOccurs = 0;
	particle->maxOccurs = UNBOUNDED;
	sequence->children = (xmlSchemaTreeItemPtr) particle;
	/* The wildcard */
	wild = (xmlSchemaWildcardPtr) xmlMalloc(sizeof(xmlSchemaWildcard));
	if (wild == NULL) {
	    xmlSchemaTypeErrMemory();
	    goto error;
	}
	memset(wild, 0, sizeof(xmlSchemaWildcard));
	wild->type = XML_SCHEMA_TYPE_ANY;
	wild->any = 1;
	wild->processContents = XML_SCHEMAS_ANY_LAX;
	particle->children = (xmlSchemaTreeItemPtr) wild;
	/*
	* Create the attribute wildcard.
	*/
	wild = (xmlSchemaWildcardPtr) xmlMalloc(sizeof(xmlSchemaWildcard));
	if (wild == NULL) {
	    xmlSchemaTypeErrMemory();
	    goto error;
	}
	memset(wild, 0, sizeof(xmlSchemaWildcard));
	wild->any = 1;
	wild->processContents = XML_SCHEMAS_ANY_LAX;
	xmlSchemaTypeAnyTypeDef->attributeWildcard = wild;
    }
    xmlSchemaTypeAnySimpleTypeDef = xmlSchemaInitBasicType("anySimpleType",
                                                           XML_SCHEMAS_ANYSIMPLETYPE,
							   xmlSchemaTypeAnyTypeDef);
    if (xmlSchemaTypeAnySimpleTypeDef == NULL)
        goto error;
    /*
    * primitive datatypes
    */
    xmlSchemaTypeStringDef = xmlSchemaInitBasicType("string",
                                                    XML_SCHEMAS_STRING,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeStringDef == NULL)
        goto error;
    xmlSchemaTypeDecimalDef = xmlSchemaInitBasicType("decimal",
                                                     XML_SCHEMAS_DECIMAL,
						     xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDecimalDef == NULL)
        goto error;
    xmlSchemaTypeDateDef = xmlSchemaInitBasicType("date",
                                                  XML_SCHEMAS_DATE,
						  xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDateDef == NULL)
        goto error;
    xmlSchemaTypeDatetimeDef = xmlSchemaInitBasicType("dateTime",
                                                      XML_SCHEMAS_DATETIME,
						      xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDatetimeDef == NULL)
        goto error;
    xmlSchemaTypeTimeDef = xmlSchemaInitBasicType("time",
                                                  XML_SCHEMAS_TIME,
						  xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeTimeDef == NULL)
        goto error;
    xmlSchemaTypeGYearDef = xmlSchemaInitBasicType("gYear",
                                                   XML_SCHEMAS_GYEAR,
						   xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGYearDef == NULL)
        goto error;
    xmlSchemaTypeGYearMonthDef = xmlSchemaInitBasicType("gYearMonth",
                                                        XML_SCHEMAS_GYEARMONTH,
							xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGYearMonthDef == NULL)
        goto error;
    xmlSchemaTypeGMonthDef = xmlSchemaInitBasicType("gMonth",
                                                    XML_SCHEMAS_GMONTH,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGMonthDef == NULL)
        goto error;
    xmlSchemaTypeGMonthDayDef = xmlSchemaInitBasicType("gMonthDay",
                                                       XML_SCHEMAS_GMONTHDAY,
						       xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGMonthDayDef == NULL)
        goto error;
    xmlSchemaTypeGDayDef = xmlSchemaInitBasicType("gDay",
                                                  XML_SCHEMAS_GDAY,
						  xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGDayDef == NULL)
        goto error;
    xmlSchemaTypeDurationDef = xmlSchemaInitBasicType("duration",
                                                      XML_SCHEMAS_DURATION,
						      xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDurationDef == NULL)
        goto error;
    xmlSchemaTypeFloatDef = xmlSchemaInitBasicType("float",
                                                   XML_SCHEMAS_FLOAT,
						   xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeFloatDef == NULL)
        goto error;
    xmlSchemaTypeDoubleDef = xmlSchemaInitBasicType("double",
                                                    XML_SCHEMAS_DOUBLE,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDoubleDef == NULL)
        goto error;
    xmlSchemaTypeBooleanDef = xmlSchemaInitBasicType("boolean",
                                                     XML_SCHEMAS_BOOLEAN,
						     xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeBooleanDef == NULL)
        goto error;
    xmlSchemaTypeAnyURIDef = xmlSchemaInitBasicType("anyURI",
                                                    XML_SCHEMAS_ANYURI,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeAnyURIDef == NULL)
        goto error;
    xmlSchemaTypeHexBinaryDef = xmlSchemaInitBasicType("hexBinary",
                                                     XML_SCHEMAS_HEXBINARY,
						     xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeHexBinaryDef == NULL)
        goto error;
    xmlSchemaTypeBase64BinaryDef
        = xmlSchemaInitBasicType("base64Binary", XML_SCHEMAS_BASE64BINARY,
	xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeBase64BinaryDef == NULL)
        goto error;
    xmlSchemaTypeNotationDef = xmlSchemaInitBasicType("NOTATION",
                                                    XML_SCHEMAS_NOTATION,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeNotationDef == NULL)
        goto error;
    xmlSchemaTypeQNameDef = xmlSchemaInitBasicType("QName",
                                                   XML_SCHEMAS_QNAME,
						   xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeQNameDef == NULL)
        goto error;

    /*
     * derived datatypes
     */
    xmlSchemaTypeIntegerDef = xmlSchemaInitBasicType("integer",
                                                     XML_SCHEMAS_INTEGER,
						     xmlSchemaTypeDecimalDef);
    if (xmlSchemaTypeIntegerDef == NULL)
        goto error;
    xmlSchemaTypeNonPositiveIntegerDef =
        xmlSchemaInitBasicType("nonPositiveInteger",
                               XML_SCHEMAS_NPINTEGER,
			       xmlSchemaTypeIntegerDef);
    if (xmlSchemaTypeNonPositiveIntegerDef == NULL)
        goto error;
    xmlSchemaTypeNegativeIntegerDef =
        xmlSchemaInitBasicType("negativeInteger", XML_SCHEMAS_NINTEGER,
	xmlSchemaTypeNonPositiveIntegerDef);
    if (xmlSchemaTypeNegativeIntegerDef == NULL)
        goto error;
    xmlSchemaTypeLongDef =
        xmlSchemaInitBasicType("long", XML_SCHEMAS_LONG,
	xmlSchemaTypeIntegerDef);
    if (xmlSchemaTypeLongDef == NULL)
        goto error;
    xmlSchemaTypeIntDef = xmlSchemaInitBasicType("int", XML_SCHEMAS_INT,
	xmlSchemaTypeLongDef);
    if (xmlSchemaTypeIntDef == NULL)
        goto error;
    xmlSchemaTypeShortDef = xmlSchemaInitBasicType("short",
                                                   XML_SCHEMAS_SHORT,
						   xmlSchemaTypeIntDef);
    if (xmlSchemaTypeShortDef == NULL)
        goto error;
    xmlSchemaTypeByteDef = xmlSchemaInitBasicType("byte",
                                                  XML_SCHEMAS_BYTE,
						  xmlSchemaTypeShortDef);
    if (xmlSchemaTypeByteDef == NULL)
        goto error;
    xmlSchemaTypeNonNegativeIntegerDef =
        xmlSchemaInitBasicType("nonNegativeInteger",
                               XML_SCHEMAS_NNINTEGER,
			       xmlSchemaTypeIntegerDef);
    if (xmlSchemaTypeNonNegativeIntegerDef == NULL)
        goto error;
    xmlSchemaTypeUnsignedLongDef =
        xmlSchemaInitBasicType("unsignedLong", XML_SCHEMAS_ULONG,
	xmlSchemaTypeNonNegativeIntegerDef);
    if (xmlSchemaTypeUnsignedLongDef == NULL)
        goto error;
    xmlSchemaTypeUnsignedIntDef =
        xmlSchemaInitBasicType("unsignedInt", XML_SCHEMAS_UINT,
	xmlSchemaTypeUnsignedLongDef);
    if (xmlSchemaTypeUnsignedIntDef == NULL)
        goto error;
    xmlSchemaTypeUnsignedShortDef =
        xmlSchemaInitBasicType("unsignedShort", XML_SCHEMAS_USHORT,
	xmlSchemaTypeUnsignedIntDef);
    if (xmlSchemaTypeUnsignedShortDef == NULL)
        goto error;
    xmlSchemaTypeUnsignedByteDef =
        xmlSchemaInitBasicType("unsignedByte", XML_SCHEMAS_UBYTE,
	xmlSchemaTypeUnsignedShortDef);
    if (xmlSchemaTypeUnsignedByteDef == NULL)
        goto error;
    xmlSchemaTypePositiveIntegerDef =
        xmlSchemaInitBasicType("positiveInteger", XML_SCHEMAS_PINTEGER,
	xmlSchemaTypeNonNegativeIntegerDef);
    if (xmlSchemaTypePositiveIntegerDef == NULL)
        goto error;
    xmlSchemaTypeNormStringDef = xmlSchemaInitBasicType("normalizedString",
                                                        XML_SCHEMAS_NORMSTRING,
							xmlSchemaTypeStringDef);
    if (xmlSchemaTypeNormStringDef == NULL)
        goto error;
    xmlSchemaTypeTokenDef = xmlSchemaInitBasicType("token",
                                                   XML_SCHEMAS_TOKEN,
						   xmlSchemaTypeNormStringDef);
    if (xmlSchemaTypeTokenDef == NULL)
        goto error;
    xmlSchemaTypeLanguageDef = xmlSchemaInitBasicType("language",
                                                      XML_SCHEMAS_LANGUAGE,
						      xmlSchemaTypeTokenDef);
    if (xmlSchemaTypeLanguageDef == NULL)
        goto error;
    xmlSchemaTypeNameDef = xmlSchemaInitBasicType("Name",
                                                  XML_SCHEMAS_NAME,
						  xmlSchemaTypeTokenDef);
    if (xmlSchemaTypeNameDef == NULL)
        goto error;
    xmlSchemaTypeNmtokenDef = xmlSchemaInitBasicType("NMTOKEN",
                                                     XML_SCHEMAS_NMTOKEN,
						     xmlSchemaTypeTokenDef);
    if (xmlSchemaTypeNmtokenDef == NULL)
        goto error;
    xmlSchemaTypeNCNameDef = xmlSchemaInitBasicType("NCName",
                                                    XML_SCHEMAS_NCNAME,
						    xmlSchemaTypeNameDef);
    if (xmlSchemaTypeNCNameDef == NULL)
        goto error;
    xmlSchemaTypeIdDef = xmlSchemaInitBasicType("ID", XML_SCHEMAS_ID,
						    xmlSchemaTypeNCNameDef);
    if (xmlSchemaTypeIdDef == NULL)
        goto error;
    xmlSchemaTypeIdrefDef = xmlSchemaInitBasicType("IDREF",
                                                   XML_SCHEMAS_IDREF,
						   xmlSchemaTypeNCNameDef);
    if (xmlSchemaTypeIdrefDef == NULL)
        goto error;
    xmlSchemaTypeEntityDef = xmlSchemaInitBasicType("ENTITY",
                                                    XML_SCHEMAS_ENTITY,
						    xmlSchemaTypeNCNameDef);
    if (xmlSchemaTypeEntityDef == NULL)
        goto error;
    /*
    * Derived list types.
    */
    /* ENTITIES */
    xmlSchemaTypeEntitiesDef = xmlSchemaInitBasicType("ENTITIES",
                                                      XML_SCHEMAS_ENTITIES,
						      xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeEntitiesDef == NULL)
        goto error;
    xmlSchemaTypeEntitiesDef->subtypes = xmlSchemaTypeEntityDef;
    /* IDREFS */
    xmlSchemaTypeIdrefsDef = xmlSchemaInitBasicType("IDREFS",
                                                    XML_SCHEMAS_IDREFS,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeIdrefsDef == NULL)
        goto error;
    xmlSchemaTypeIdrefsDef->subtypes = xmlSchemaTypeIdrefDef;

    /* NMTOKENS */
    xmlSchemaTypeNmtokensDef = xmlSchemaInitBasicType("NMTOKENS",
                                                      XML_SCHEMAS_NMTOKENS,
						      xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeNmtokensDef == NULL)
        goto error;
    xmlSchemaTypeNmtokensDef->subtypes = xmlSchemaTypeNmtokenDef;

    xmlSchemaTypesInitialized = 1;
    return (0);

error:
    xmlSchemaCleanupTypesInternal();
    return (-1);
}